

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_group_assign(chunk *c,monster *mon,monster_group_info *info,_Bool loading)

{
  wchar_t index_00;
  monster_group_conflict *group_00;
  mon_group_list_entry *p;
  mon_group_list_entry_conflict *entry;
  monster_group *pmStack_30;
  wchar_t i;
  monster_group_conflict *group;
  wchar_t index;
  _Bool loading_local;
  monster_group_info *info_local;
  monster *mon_local;
  chunk *c_local;
  
  group_00 = monster_group_by_index(c,info->index);
  if (loading) {
    for (entry._4_4_ = 0; entry._4_4_ < 2; entry._4_4_ = entry._4_4_ + 1) {
      p = (mon_group_list_entry *)mem_zalloc(0x10);
      index_00 = info[entry._4_4_].index;
      if (index_00 == L'\0') {
        if (entry._4_4_ != 0) {
          mem_free(p);
          return;
        }
        quit_fmt("Monster %d has no group",(ulong)(uint)mon->midx);
      }
      pmStack_30 = (monster_group *)monster_group_by_index(c,index_00);
      if (pmStack_30 == (monster_group *)0x0) {
        pmStack_30 = (monster_group *)monster_group_new();
        pmStack_30->index = index_00;
        c->monster_groups[index_00] = pmStack_30;
      }
      if (info[entry._4_4_].role == MON_GROUP_LEADER) {
        pmStack_30->leader = mon->midx;
      }
      p->midx = mon->midx;
      p->next = pmStack_30->member_list;
      pmStack_30->member_list = p;
    }
  }
  else if (group_00 == (monster_group_conflict *)0x0) {
    monster_group_start(c,mon,L'\0');
  }
  else {
    monster_add_to_group(c,mon,group_00);
  }
  return;
}

Assistant:

void monster_group_assign(struct chunk *c, struct monster *mon,
						  struct monster_group_info *info, bool loading)
{
	int index = info[PRIMARY_GROUP].index;
	struct monster_group *group = monster_group_by_index(c, index);

	if (!loading) {
		/* For newly created monsters, use the group start and add functions */
		if (group) {
			monster_add_to_group(c, mon, group);
		} else {
			monster_group_start(c, mon, 0);
		}
	} else {
		/* For loading from a savefile, build by hand */
		int i;

		for (i = 0; i < GROUP_MAX; i++) {
			struct mon_group_list_entry *entry = mem_zalloc(sizeof(*entry));

			/* Check the index */
			index = info[i].index;
			if (!index) {
				if (i == PRIMARY_GROUP) {
					/* Everything should have a primary group */
					quit_fmt("Monster %d has no group", mon->midx);
				} else {
					/* Plenty of things have no summon group */
					mem_free(entry);
					return;
				}
			}

			/* Fill out the group, creating if necessary */
			group = monster_group_by_index(c, index);
			if (!group) {
				group = monster_group_new();
				group->index = index;
				c->monster_groups[index] = group;
			}
			if (info[i].role == MON_GROUP_LEADER) {
				group->leader = mon->midx;
			}

			/* Add this monster */
			entry->midx = mon->midx;
			entry->next = group->member_list;
			group->member_list = entry;
		}
	}
}